

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_get_color_profile
               (LodePNGColorProfile *profile,uchar *in,uint w,uint h,LodePNGColorMode *mode)

{
  LodePNGColorType LVar1;
  bool bVar2;
  byte b_00;
  byte bVar3;
  byte bVar4;
  LodePNGColorProfile *pLVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  undefined4 in_register_0000000c;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  ulong in_R11;
  undefined7 uVar12;
  size_t sVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  unsigned_short a;
  ColorTree tree;
  unsigned_short local_10c;
  unsigned_short local_10a;
  unsigned_short local_108;
  unsigned_short local_106;
  byte local_104;
  byte local_103;
  byte local_102;
  byte local_101;
  LodePNGColorProfile *local_100;
  ulong local_f8;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uchar *local_e0;
  LodePNGColorMode *local_d8;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  int local_38;
  
  local_f8 = CONCAT44(in_register_0000000c,h);
  LVar1 = mode->colortype;
  bVar14 = (LVar1 & ~LCT_GREY_ALPHA) == LCT_GREY;
  local_e0 = in;
  uVar6 = lodepng_can_have_alpha(mode);
  iVar8 = 0;
  if ((ulong)LVar1 < 7) {
    iVar8 = *(int *)(&DAT_00ad9c04 + (ulong)LVar1 * 4);
  }
  local_ec = iVar8 * mode->bitdepth;
  local_f8 = (ulong)((int)local_f8 * w);
  bVar15 = local_ec == 1;
  local_f0 = 2;
  if (8 < local_ec) {
    local_f0 = 0x101;
  }
  if ((8 >= local_ec && !bVar15) && (local_f0 = 4, local_ec != 2)) {
    local_f0 = 0x100;
    if (local_ec == 4) {
      local_f0 = 0x10;
    }
  }
  uVar6 = uVar6 ^ 1;
  uVar9 = (ulong)bVar14;
  local_78 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_b8 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_38 = -1;
  local_100 = profile;
  local_d8 = mode;
  if ((mode->bitdepth == 0x10) && (local_f8 != 0)) {
    sVar13 = 0;
    do {
      getPixelColorRGBA16(&local_108,&local_10a,&local_10c,&local_106,local_e0,sVar13,local_d8);
      if (((((local_108 & 0xff) != local_108 >> 8) || ((local_10a & 0xff) != local_10a >> 8)) ||
          ((local_10c & 0xff) != local_10c >> 8)) || ((local_106 & 0xff) != local_106 >> 8)) {
        sVar13 = 0;
        local_108 = 0;
        local_10a = 0;
        local_10c = 0;
        local_106 = 0;
        profile->bits = 0x10;
        goto LAB_0053374d;
      }
      sVar13 = sVar13 + 1;
    } while (local_f8 != sVar13);
  }
  bVar2 = false;
  local_e4 = (uint)bVar14;
  local_108 = local_108 & 0xff00;
  local_10a = local_10a & 0xff00;
  local_10c = local_10c & 0xff00;
  local_106 = local_106 & 0xff00;
  local_104 = bVar15;
  local_e8 = uVar6;
  if (local_f8 != 0) {
    sVar13 = 0;
    do {
      getPixelColorRGBA8((uchar *)&local_108,(uchar *)&local_10a,(uchar *)&local_10c,
                         (uchar *)&local_106,local_e0,sVar13,local_d8);
      uVar6 = local_100->bits;
      bVar10 = (byte)local_108;
      if (uVar6 < 8 && (local_104 & 1) == 0) {
        uVar7 = 1;
        if ((1 < (byte)((byte)local_108 + 1)) && (uVar7 = 8, (byte)((byte)local_108 * -0xf) < 0x10))
        {
          bVar14 = 3 < (byte)((byte)local_108 * -3);
          uVar7 = bVar14 + 2 + (uint)bVar14;
        }
        if (uVar6 < uVar7) {
          local_100->bits = uVar7;
          uVar6 = uVar7;
        }
      }
      local_104 = local_ec <= uVar6;
      uVar9 = CONCAT71((int7)(uVar9 >> 8),1);
      in_R11 = CONCAT71((int7)(in_R11 >> 8),1);
      bVar14 = local_e4 == 0;
      local_e4 = 1;
      bVar3 = (byte)local_10a;
      b_00 = (byte)local_10c;
      uVar7 = uVar6;
      if (bVar14) {
        if ((byte)local_108 == (byte)local_10a) {
          local_e4 = 0;
          in_R11 = 0;
          if ((byte)local_108 == (byte)local_10c) goto LAB_00533404;
        }
        uVar12 = (undefined7)(in_R11 >> 8);
        in_R11 = CONCAT71(uVar12,1);
        local_e4 = 1;
        local_100->colored = 1;
        if (uVar6 < 8) {
          uVar7 = 8;
          in_R11 = CONCAT71(uVar12,1);
          local_100->bits = 8;
        }
      }
LAB_00533404:
      bVar4 = (byte)local_106;
      if (local_e8 == 0) {
        if ((local_100->key_r == (local_108 & 0xff)) && (local_100->key_g == (local_10a & 0xff))) {
          bVar14 = local_100->key_b == (local_10c & 0xff);
        }
        else {
          bVar14 = false;
        }
        if ((byte)local_106 == 0xff) {
          uVar9 = 0;
          local_e8 = 0;
          if ((bool)(local_100->key != 0 & bVar14)) {
            local_100->alpha = 1;
            if (uVar7 < 8) goto LAB_0053360f;
            goto LAB_00533411;
          }
        }
        else {
          if (((byte)local_106 != 0) || (local_100->key != 0 && !bVar14)) {
            local_100->alpha = 1;
            if (uVar7 < 8) {
LAB_0053360f:
              local_100->bits = 8;
              goto LAB_00533411;
            }
            goto LAB_00533414;
          }
          uVar9 = 0;
          local_e8 = 0;
          if (local_100->key == 0 && local_100->alpha == 0) {
            local_100->key = 1;
            local_100->key_r = local_108 & 0xff;
            uVar9 = 0;
            local_e8 = 0;
            local_100->key_g = local_10a & 0xff;
            local_100->key_b = local_10c & 0xff;
          }
        }
      }
      else {
LAB_00533411:
        uVar9 = CONCAT71((int7)(uVar9 >> 8),1);
LAB_00533414:
        local_e8 = 1;
      }
      bVar14 = true;
      if (bVar2) {
LAB_00533426:
        bVar2 = bVar14;
        bVar10 = (byte)uVar9 & bVar2;
        uVar9 = CONCAT71((int7)(uVar9 >> 8),bVar10);
        bVar10 = (byte)in_R11 & bVar10;
        in_R11 = CONCAT71((int7)(in_R11 >> 8),bVar10);
        if ((bVar10 == 1) && (local_ec <= uVar6)) break;
      }
      else {
        local_c4 = (uint)uVar9;
        uVar9 = CONCAT71((int7)(uVar9 >> 8),(byte)local_10a);
        local_c0 = (uint)in_R11;
        local_c8 = (uint)(byte)local_10a;
        local_cc = (uint)(byte)local_108;
        local_d0 = (uint)(byte)local_106;
        local_bc = uVar6;
        iVar8 = color_tree_get((ColorTree *)local_b8,(byte)local_108,(byte)local_10a,(byte)local_10c
                               ,(byte)local_106);
        pLVar5 = local_100;
        bVar2 = false;
        if (iVar8 < 0) {
          local_103 = bVar4;
          local_102 = b_00;
          local_101 = bVar3;
          color_tree_add((ColorTree *)local_b8,(uchar)local_cc,(uchar)local_c8,b_00,(uchar)local_d0,
                         local_100->numcolors);
          uVar7 = pLVar5->numcolors;
          if ((ulong)uVar7 < 0x100) {
            uVar9 = (ulong)(uVar7 * 4);
            pLVar5->palette[(ulong)uVar7 * 4] = bVar10;
            pLVar5->palette[uVar9 + 1] = local_101;
            pLVar5->palette[uVar9 + 2] = local_102;
            pLVar5->palette[uVar9 + 3] = local_103;
          }
          in_R11 = (ulong)local_c0;
          uVar9 = (ulong)local_c4;
          pLVar5->numcolors = uVar7 + 1;
          uVar6 = local_bc;
          bVar14 = local_f0 <= uVar7 + 1;
          goto LAB_00533426;
        }
      }
      sVar13 = sVar13 + 1;
    } while (local_f8 != sVar13);
  }
  if ((local_100->key != 0) && (local_100->alpha == 0 && (int)local_f8 != 0)) {
    sVar13 = 0;
    do {
      getPixelColorRGBA8((uchar *)&local_108,(uchar *)&local_10a,(uchar *)&local_10c,
                         (uchar *)&local_106,local_e0,sVar13,local_d8);
      if (((((byte)local_106 != '\0') && (local_100->key_r == (local_108 & 0xff))) &&
          (local_100->key_g == (local_10a & 0xff))) && (local_100->key_b == (local_10c & 0xff))) {
        local_100->alpha = 1;
      }
      sVar13 = sVar13 + 1;
    } while (local_f8 != sVar13);
  }
  uVar6._0_2_ = local_100->key_r;
  uVar6._2_2_ = local_100->key_g;
  auVar16 = vpsllw_avx(ZEXT416(uVar6),8);
  auVar16 = vpaddw_avx(ZEXT416(uVar6),auVar16);
  local_100->key_r = (short)auVar16._0_4_;
  local_100->key_g = (short)((uint)auVar16._0_4_ >> 0x10);
  local_100->key_b = (short)(*(int *)&local_100->key_b << 8) + (short)*(int *)&local_100->key_b;
LAB_005336f9:
  color_tree_cleanup((ColorTree *)local_b8);
  return 0;
  while (sVar13 = sVar13 + 1, uVar9 = uVar11, local_f8 != sVar13) {
LAB_0053374d:
    getPixelColorRGBA16(&local_108,&local_10a,&local_10c,&local_106,local_e0,sVar13,local_d8);
    uVar11 = 1;
    bVar14 = true;
    if ((int)uVar9 == 0) {
      if (local_108 == local_10a) {
        uVar11 = 0;
        bVar14 = false;
        if (local_108 == local_10c) goto LAB_005337ab;
      }
      bVar14 = true;
      uVar11 = 1;
      profile->colored = 1;
    }
LAB_005337ab:
    if (uVar6 == 0) {
      if ((local_108 == profile->key_r) && (local_10a == profile->key_g)) {
        bVar15 = local_10c == profile->key_b;
      }
      else {
        bVar15 = false;
      }
      if (local_106 == 0xffff) {
        uVar6 = 0;
        if ((bool)(profile->key != 0 & bVar15)) goto LAB_00533849;
      }
      else {
        if ((local_106 != 0) || (!(bool)(profile->key == 0 | bVar15))) {
LAB_00533849:
          profile->alpha = 1;
          goto LAB_00533852;
        }
        uVar6 = 0;
        if (profile->key == 0 && profile->alpha == 0) {
          profile->key = 1;
          profile->key_r = local_108;
          profile->key_g = local_10a;
          profile->key_b = local_10c;
        }
      }
    }
    else {
LAB_00533852:
      uVar6 = 1;
      if (bVar14) break;
    }
  }
  if ((profile->key != 0) && (local_100->alpha == 0)) {
    sVar13 = 0;
    do {
      getPixelColorRGBA16(&local_108,&local_10a,&local_10c,&local_106,local_e0,sVar13,local_d8);
      if ((((local_106 != 0) && (local_108 == local_100->key_r)) && (local_10a == local_100->key_g))
         && (local_10c == local_100->key_b)) {
        local_100->alpha = 1;
      }
      sVar13 = sVar13 + 1;
    } while (local_f8 != sVar13);
  }
  goto LAB_005336f9;
}

Assistant:

unsigned lodepng_get_color_profile(LodePNGColorProfile* profile,
                                   const unsigned char* in, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode)
{
  unsigned error = 0;
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  unsigned colored_done = lodepng_is_greyscale_type(mode) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode);
  unsigned bits_done = bpp == 1 ? 1 : 0;
  unsigned maxnumcolors = 257;
  unsigned sixteen = 0;
  if(bpp <= 8) maxnumcolors = bpp == 1 ? 2 : (bpp == 2 ? 4 : (bpp == 4 ? 16 : 256));

  color_tree_init(&tree);

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode->bitdepth == 16)
  {
    unsigned short r, g, b, a;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/
      {
        sixteen = 1;
        break;
      }
    }
  }

  if(sixteen)
  {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    profile->bits = 16;
    bits_done = numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/

    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 65535 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 65535 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
        }
      }
      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
        }
      }
    }
  }
  else /* < 16-bit */
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode);

      if(!bits_done && profile->bits < 8)
      {
        /*only r is checked, < 8 bits is only relevant for greyscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > profile->bits) profile->bits = bits;
      }
      bits_done = (profile->bits >= bpp);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
        if(profile->bits < 8) profile->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 255 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 255 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done)
      {
        if(!color_tree_has(&tree, r, g, b, a))
        {
          color_tree_add(&tree, r, g, b, a, profile->numcolors);
          if(profile->numcolors < 256)
          {
            unsigned char* p = profile->palette;
            unsigned n = profile->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++profile->numcolors;
          numcolors_done = profile->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
        }
      }
    }

    /*make the profile's key always 16-bit for consistency - repeat each byte twice*/
    profile->key_r += (profile->key_r << 8);
    profile->key_g += (profile->key_g << 8);
    profile->key_b += (profile->key_b << 8);
  }

  color_tree_cleanup(&tree);
  return error;
}